

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O3

int process_tracelog(char *fname,void *userdata)

{
  uint32 uVar1;
  int iVar2;
  ALfloat AVar3;
  ALfloat AVar4;
  ALfloat AVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint32 uVar9;
  __off_t _Var10;
  __off_t total;
  __off_t _Var11;
  ALfloat *pAVar12;
  ALfloat *pAVar13;
  ALCdevice *pAVar14;
  ALint *origvalue3;
  ALboolean *origvalues;
  ALboolean *values;
  ALuint *pAVar15;
  ALuint *pAVar16;
  ALCvoid *origbuffer;
  void *pvVar17;
  uint64 uVar18;
  ALvoid *origdata;
  ALCcontext *pAVar19;
  uint8 *puVar20;
  char *pcVar21;
  uint8 *puVar22;
  uint8 *puVar23;
  ALCint *pAVar24;
  ALCint *pAVar25;
  ALdouble AVar26;
  ALdouble *origvalues_00;
  ALdouble *values_00;
  ALint *pAVar27;
  ALint *pAVar28;
  ALfloat *origvalue3_00;
  int iVar29;
  uint uVar30;
  ALboolean okay;
  ulong uVar31;
  uint64 len;
  ALfloat *local_268;
  CallerInfo callerinfo;
  
  io_failure = '\0';
  next_mapped_threadid = 0;
  trace_scope = 0;
  guserdata = userdata;
  logfd = open(fname,0);
  if (logfd == -1) {
    process_tracelog_cold_6();
  }
  else {
    fflush(_stderr);
    uVar1 = readle32();
    if (uVar1 == 0x104e5a1) {
      uVar1 = readle32();
      if (uVar1 == 1) {
        _Var10 = lseek(logfd,0,1);
        total = lseek(logfd,0,2);
        _Var11 = lseek(logfd,_Var10,0);
        if (((_Var11 == -1) || (_Var10 == -1)) || (total == -1)) {
          process_tracelog_cold_3();
        }
        iVar29 = 0;
        if (io_failure == '\0') {
          do {
            _Var10 = lseek(logfd,0,1);
            if (_Var10 == -1) {
              process_tracelog_cold_5();
              iVar29 = 0;
              break;
            }
            iVar29 = 0;
            if (io_failure != '\0') break;
            iVar2 = visit_progress(guserdata,_Var10,total);
            if (iVar2 == 0) {
              process_tracelog_cold_4();
              iVar29 = -1;
              goto LAB_0010fe78;
            }
            uVar1 = readle32();
            switch(uVar1) {
            case 0:
              uVar1 = readle32();
              iVar29 = 1;
              if (io_failure == '\0') {
                okay = '\x01';
                goto LAB_0010fecb;
              }
              goto LAB_0010d08b;
            case 1:
              uVar1 = readle32();
              if (io_failure == '\0') {
                visit_al_error_event(guserdata,uVar1);
              }
              break;
            case 2:
              pAVar14 = (ALCdevice *)readle64();
              uVar1 = readle32();
              if (io_failure == '\0') {
                visit_alc_error_event(guserdata,pAVar14,uVar1);
              }
              break;
            case 3:
              for (uVar1 = readle32(); uVar1 != 0; uVar1 = uVar1 - 1) {
                pvVar17 = (void *)readle64();
                puVar20 = IO_BLOB((uint64 *)&callerinfo);
                if (io_failure != '\0') break;
                if ((puVar20 != (uint8 *)0x0) &&
                   (pcVar21 = strdup((char *)puVar20),
                   pcVar21 != (char *)0x0 && pvVar17 != (void *)0x0)) {
                  add_stackframe_to_map(pvVar17,pcVar21);
                }
              }
              break;
            default:
              if (io_failure == '\0') {
                iVar29 = 0;
                okay = '\0';
                uVar1 = 0;
LAB_0010fecb:
                visit_eos(guserdata,okay,uVar1);
LAB_0010fe78:
                if (io_failure != '\x01') goto LAB_0010d09b;
              }
              goto LAB_0010d08b;
            case 5:
              pAVar14 = (ALCdevice *)readle64();
              uVar1 = readle32();
              uVar8 = readle32();
              if (io_failure == '\0') {
                visit_device_state_changed_int(guserdata,pAVar14,uVar1,uVar8);
              }
              break;
            case 6:
              pAVar19 = (ALCcontext *)readle64();
              uVar1 = readle32();
              uVar8 = readle32();
              if (io_failure == '\0') {
                visit_context_state_changed_enum(guserdata,pAVar19,uVar1,uVar8);
              }
              break;
            case 7:
              pAVar19 = (ALCcontext *)readle64();
              uVar1 = readle32();
              AVar3 = (ALfloat)readle32();
              if (io_failure == '\0') {
                visit_context_state_changed_float(guserdata,pAVar19,uVar1,AVar3);
              }
              break;
            case 8:
              pAVar19 = (ALCcontext *)readle64();
              uVar1 = readle32();
              puVar20 = IO_BLOB((uint64 *)&callerinfo);
              if (io_failure == '\0') {
                visit_context_state_changed_string(guserdata,pAVar19,uVar1,(ALchar *)puVar20);
              }
              break;
            case 9:
              pAVar19 = (ALCcontext *)readle64();
              uVar1 = readle32();
              uVar8 = readle32();
              pAVar12 = (ALfloat *)get_ioblob((ulong)uVar8 * 4);
              if (uVar8 != 0) {
                uVar31 = 0;
                do {
                  AVar3 = (ALfloat)readle32();
                  pAVar12[uVar31] = AVar3;
                  uVar31 = uVar31 + 1;
                } while (uVar8 != uVar31);
              }
              if (io_failure == '\0') {
                visit_listener_state_changed_floatv(guserdata,pAVar19,uVar1,uVar8,pAVar12);
              }
              break;
            case 10:
              uVar1 = readle32();
              uVar8 = readle32();
              uVar9 = readle32();
              if (io_failure == '\0') {
                visit_source_state_changed_bool(guserdata,uVar1,uVar8,(ALboolean)uVar9);
              }
              break;
            case 0xb:
              uVar1 = readle32();
              uVar8 = readle32();
              uVar9 = readle32();
              if (io_failure == '\0') {
                visit_source_state_changed_enum(guserdata,uVar1,uVar8,uVar9);
              }
              break;
            case 0xc:
              uVar1 = readle32();
              uVar8 = readle32();
              uVar9 = readle32();
              if (io_failure == '\0') {
                visit_source_state_changed_int(guserdata,uVar1,uVar8,uVar9);
              }
              break;
            case 0xd:
              uVar1 = readle32();
              uVar8 = readle32();
              uVar9 = readle32();
              if (io_failure == '\0') {
                visit_source_state_changed_uint(guserdata,uVar1,uVar8,uVar9);
              }
              break;
            case 0xe:
              uVar1 = readle32();
              uVar8 = readle32();
              AVar3 = (ALfloat)readle32();
              if (io_failure == '\0') {
                visit_source_state_changed_float(guserdata,uVar1,uVar8,AVar3);
              }
              break;
            case 0xf:
              uVar1 = readle32();
              uVar8 = readle32();
              AVar3 = (ALfloat)readle32();
              AVar4 = (ALfloat)readle32();
              AVar5 = (ALfloat)readle32();
              if (io_failure == '\0') {
                visit_source_state_changed_float3(guserdata,uVar1,uVar8,AVar3,AVar4,AVar5);
              }
              break;
            case 0x10:
              uVar1 = readle32();
              uVar8 = readle32();
              uVar9 = readle32();
              if (io_failure == '\0') {
                visit_buffer_state_changed_int(guserdata,uVar1,uVar8,uVar9);
              }
              break;
            case 0x11:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (pAVar19 = (ALCcontext *)readle64(), io_failure == '\0'))
              {
                visit_alcGetCurrentContext(&callerinfo,pAVar19);
              }
              break;
            case 0x12:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar19 = (ALCcontext *)readle64();
                pAVar14 = (ALCdevice *)readle64();
                if (io_failure == '\0') {
                  visit_alcGetContextsDevice(&callerinfo,pAVar14,pAVar19);
                }
              }
              break;
            case 0x13:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                puVar20 = IO_BLOB(&len);
                uVar1 = readle32();
                if (io_failure == '\0') {
                  visit_alcIsExtensionPresent
                            (&callerinfo,(ALCboolean)uVar1,pAVar14,(ALCchar *)puVar20);
                }
              }
              break;
            case 0x14:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                puVar20 = IO_BLOB(&len);
                pvVar17 = (void *)readle64();
                if (io_failure == '\0') {
                  visit_alcGetProcAddress(&callerinfo,pvVar17,pAVar14,(ALCchar *)puVar20);
                }
              }
              break;
            case 0x15:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                puVar20 = IO_BLOB(&len);
                uVar1 = readle32();
                if (io_failure == '\0') {
                  visit_alcGetEnumValue(&callerinfo,uVar1,pAVar14,(ALCchar *)puVar20);
                }
              }
              break;
            case 0x16:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                uVar1 = readle32();
                puVar20 = IO_BLOB(&len);
                if (io_failure == '\0') {
                  visit_alcGetString(&callerinfo,(ALCchar *)puVar20,pAVar14,uVar1);
                }
              }
              break;
            case 0x17:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                puVar20 = IO_BLOB(&len);
                uVar1 = readle32();
                uVar8 = readle32();
                local_268 = (ALfloat *)CONCAT44(local_268._4_4_,uVar8);
                uVar18 = readle64();
                pAVar14 = (ALCdevice *)readle64();
                if (pAVar14 == (ALCdevice *)0x0) {
                  puVar22 = (uint8 *)0x0;
                  uVar8 = 0;
                  uVar9 = 0;
                  puVar23 = (uint8 *)0x0;
                }
                else {
                  uVar8 = readle32();
                  uVar9 = readle32();
                  puVar22 = IO_BLOB(&len);
                  puVar23 = IO_BLOB(&len);
                }
                if (io_failure == '\0') {
                  visit_alcCaptureOpenDevice
                            (&callerinfo,pAVar14,(ALCchar *)puVar20,uVar1,(uint32)local_268,
                             (ALCsizei)uVar18,uVar8,uVar9,(ALCchar *)puVar22,(ALCchar *)puVar23);
                }
              }
              break;
            case 0x18:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                uVar1 = readle32();
                if (io_failure == '\0') {
                  visit_alcCaptureCloseDevice(&callerinfo,(ALCboolean)uVar1,pAVar14);
                }
LAB_0010ee29:
                add_devicelabel_to_map(pAVar14,(char *)0x0);
              }
              break;
            case 0x19:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                puVar20 = IO_BLOB(&len);
                pAVar14 = (ALCdevice *)readle64();
                if (pAVar14 == (ALCdevice *)0x0) {
                  puVar22 = (uint8 *)0x0;
                  uVar1 = 0;
                  uVar8 = 0;
                  puVar23 = (uint8 *)0x0;
                }
                else {
                  uVar1 = readle32();
                  uVar8 = readle32();
                  puVar22 = IO_BLOB(&len);
                  puVar23 = IO_BLOB(&len);
                }
                if (io_failure == '\0') {
                  visit_alcOpenDevice(&callerinfo,pAVar14,(ALCchar *)puVar20,uVar1,uVar8,
                                      (ALCchar *)puVar22,(ALCchar *)puVar23);
                }
              }
              break;
            case 0x1a:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                uVar1 = readle32();
                if (io_failure == '\0') {
                  visit_alcCloseDevice(&callerinfo,(ALCboolean)uVar1,pAVar14);
                }
                goto LAB_0010ee29;
              }
              break;
            case 0x1b:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                pAVar24 = (ALCint *)readle64();
                uVar1 = readle32();
                if (uVar1 == 0) {
                  pAVar25 = (ALCint *)0x0;
                }
                else {
                  pAVar25 = (ALCint *)get_ioblob((ulong)uVar1 * 4);
                  uVar31 = 0;
                  do {
                    uVar8 = readle32();
                    pAVar25[uVar31] = uVar8;
                    uVar31 = uVar31 + 1;
                  } while (uVar1 != uVar31);
                }
                pAVar19 = (ALCcontext *)readle64();
                if (io_failure == '\0') {
                  visit_alcCreateContext(&callerinfo,pAVar19,pAVar14,pAVar24,uVar1,pAVar25);
                }
              }
              break;
            case 0x1c:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar19 = (ALCcontext *)readle64();
                uVar1 = readle32();
                if (io_failure == '\0') {
                  visit_alcMakeContextCurrent(&callerinfo,(ALCboolean)uVar1,pAVar19);
                }
              }
              break;
            case 0x1d:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (pAVar19 = (ALCcontext *)readle64(), io_failure == '\0'))
              {
                visit_alcProcessContext(&callerinfo,pAVar19);
              }
              break;
            case 0x1e:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (pAVar19 = (ALCcontext *)readle64(), io_failure == '\0'))
              {
                visit_alcSuspendContext(&callerinfo,pAVar19);
              }
              break;
            case 0x1f:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar19 = (ALCcontext *)readle64();
                if (io_failure == '\0') {
                  visit_alcDestroyContext(&callerinfo,pAVar19);
                }
                add_contextlabel_to_map(pAVar19,(char *)0x0);
              }
              break;
            case 0x20:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                uVar1 = readle32();
                if (io_failure == '\0') {
                  visit_alcGetError(&callerinfo,uVar1,pAVar14);
                }
              }
              break;
            case 0x21:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                uVar1 = readle32();
                uVar18 = readle64();
                pAVar24 = (ALCint *)readle64();
                uVar30 = (uint)uVar18;
                if (pAVar24 == (ALCint *)0x0) {
                  pAVar25 = (ALCint *)0x0;
                }
                else {
                  pAVar25 = (ALCint *)get_ioblob((long)(int)uVar30 << 2);
                  if (0 < (int)uVar30) {
                    local_268 = (ALfloat *)CONCAT44(local_268._4_4_,uVar1);
                    uVar31 = 0;
                    do {
                      uVar1 = readle32();
                      pAVar25[uVar31] = uVar1;
                      uVar31 = uVar31 + 1;
                    } while ((uVar30 & 0x7fffffff) != uVar31);
                    uVar1 = (uint32)local_268;
                  }
                }
                if (io_failure == '\0') {
                  visit_alcGetIntegerv
                            (&callerinfo,pAVar14,uVar1,uVar30,pAVar24,uVar1 == 0x313,pAVar25);
                }
              }
              break;
            case 0x22:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (pAVar14 = (ALCdevice *)readle64(), io_failure == '\0')) {
                visit_alcCaptureStart(&callerinfo,pAVar14);
              }
              break;
            case 0x23:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (pAVar14 = (ALCdevice *)readle64(), io_failure == '\0')) {
                visit_alcCaptureStop(&callerinfo,pAVar14);
              }
              break;
            case 0x24:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                origbuffer = (ALCvoid *)readle64();
                uVar18 = readle64();
                puVar20 = IO_BLOB(&len);
                if (io_failure == '\0') {
                  visit_alcCaptureSamples
                            (&callerinfo,pAVar14,origbuffer,puVar20,(ALCsizei)len,(ALCsizei)uVar18);
                }
              }
              break;
            case 0x25:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (AVar3 = (ALfloat)readle32(), io_failure == '\0')) {
                visit_alDopplerFactor(&callerinfo,AVar3);
              }
              break;
            case 0x26:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (AVar3 = (ALfloat)readle32(), io_failure == '\0')) {
                visit_alDopplerVelocity(&callerinfo,AVar3);
              }
              break;
            case 0x27:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (AVar3 = (ALfloat)readle32(), io_failure == '\0')) {
                visit_alSpeedOfSound(&callerinfo,AVar3);
              }
              break;
            case 0x28:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (uVar1 = readle32(), io_failure == '\0')) {
                visit_alDistanceModel(&callerinfo,uVar1);
              }
              break;
            case 0x29:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (uVar1 = readle32(), io_failure == '\0')) {
                visit_alEnable(&callerinfo,uVar1);
              }
              break;
            case 0x2a:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (uVar1 = readle32(), io_failure == '\0')) {
                visit_alDisable(&callerinfo,uVar1);
              }
              break;
            case 0x2b:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                if (io_failure == '\0') {
                  visit_alIsEnabled(&callerinfo,(ALboolean)uVar8,uVar1);
                }
              }
              break;
            case 0x2c:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                puVar20 = IO_BLOB(&len);
                if (io_failure == '\0') {
                  visit_alGetString(&callerinfo,(ALchar *)puVar20,uVar1);
                }
              }
              break;
            case 0x2d:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                origvalues = (ALboolean *)readle64();
                uVar8 = readle32();
                if (uVar8 == 0) {
                  values = (ALboolean *)0x0;
                }
                else {
                  values = (ALboolean *)get_ioblob((ulong)uVar8);
                  uVar31 = 0;
                  do {
                    uVar9 = readle32();
                    values[uVar31] = (ALboolean)uVar9;
                    uVar31 = uVar31 + 1;
                  } while (uVar8 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alGetBooleanv(&callerinfo,uVar1,origvalues,uVar8,values);
                }
              }
              break;
            case 0x2e:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                pAVar27 = (ALint *)readle64();
                uVar8 = readle32();
                if (uVar8 == 0) {
                  pAVar28 = (ALint *)0x0;
                }
                else {
                  pAVar28 = (ALint *)get_ioblob((ulong)uVar8 * 4);
                  uVar31 = 0;
                  do {
                    uVar9 = readle32();
                    pAVar28[uVar31] = uVar9;
                    uVar31 = uVar31 + 1;
                  } while (uVar8 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alGetIntegerv(&callerinfo,uVar1,pAVar27,uVar8,uVar1 == 0xd000,pAVar28);
                }
              }
              break;
            case 0x2f:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                pAVar12 = (ALfloat *)readle64();
                uVar8 = readle32();
                if (uVar8 == 0) {
                  pAVar13 = (ALfloat *)0x0;
                }
                else {
                  pAVar13 = (ALfloat *)get_ioblob((ulong)uVar8 * 4);
                  uVar31 = 0;
                  do {
                    AVar3 = (ALfloat)readle32();
                    pAVar13[uVar31] = AVar3;
                    uVar31 = uVar31 + 1;
                  } while (uVar8 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alGetFloatv(&callerinfo,uVar1,pAVar12,uVar8,pAVar13);
                }
              }
              break;
            case 0x30:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                origvalues_00 = (ALdouble *)readle64();
                uVar8 = readle32();
                if (uVar8 == 0) {
                  values_00 = (ALdouble *)0x0;
                }
                else {
                  values_00 = (ALdouble *)get_ioblob((ulong)uVar8 * 8);
                  uVar31 = 0;
                  do {
                    AVar26 = (ALdouble)readle64();
                    values_00[uVar31] = AVar26;
                    uVar31 = uVar31 + 1;
                  } while (uVar8 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alGetDoublev(&callerinfo,uVar1,origvalues_00,uVar8,values_00);
                }
              }
              break;
            case 0x31:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                if (io_failure == '\0') {
                  visit_alGetBoolean(&callerinfo,(ALboolean)uVar8,uVar1);
                }
              }
              break;
            case 0x32:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                if (io_failure == '\0') {
                  visit_alGetInteger(&callerinfo,uVar8,uVar1);
                }
              }
              break;
            case 0x33:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                AVar3 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alGetFloat(&callerinfo,AVar3,uVar1);
                }
              }
              break;
            case 0x34:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                AVar26 = (ALdouble)readle64();
                if (io_failure == '\0') {
                  visit_alGetDouble(&callerinfo,AVar26,uVar1);
                }
              }
              break;
            case 0x35:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                puVar20 = IO_BLOB(&len);
                uVar1 = readle32();
                if (io_failure == '\0') {
                  visit_alIsExtensionPresent(&callerinfo,(ALboolean)uVar1,(ALchar *)puVar20);
                }
              }
              break;
            case 0x36:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (uVar1 = readle32(), io_failure == '\0')) {
                visit_alGetError(&callerinfo,uVar1);
              }
              break;
            case 0x37:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                puVar20 = IO_BLOB(&len);
                pvVar17 = (void *)readle64();
                if (io_failure == '\0') {
                  visit_alGetProcAddress(&callerinfo,pvVar17,(ALchar *)puVar20);
                }
              }
              break;
            case 0x38:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                puVar20 = IO_BLOB(&len);
                uVar1 = readle32();
                if (io_failure == '\0') {
                  visit_alGetEnumValue(&callerinfo,uVar1,(ALchar *)puVar20);
                }
              }
              break;
            case 0x39:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                pAVar12 = (ALfloat *)readle64();
                uVar8 = readle32();
                if (uVar8 == 0) {
                  pAVar13 = (ALfloat *)0x0;
                }
                else {
                  pAVar13 = (ALfloat *)get_ioblob((ulong)uVar8 * 4);
                  uVar31 = 0;
                  do {
                    AVar3 = (ALfloat)readle32();
                    pAVar13[uVar31] = AVar3;
                    uVar31 = uVar31 + 1;
                  } while (uVar8 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alListenerfv(&callerinfo,uVar1,pAVar12,uVar8,pAVar13);
                }
              }
              break;
            case 0x3a:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                AVar3 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alListenerf(&callerinfo,uVar1,AVar3);
                }
              }
              break;
            case 0x3b:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                AVar3 = (ALfloat)readle32();
                AVar4 = (ALfloat)readle32();
                AVar5 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alListener3f(&callerinfo,uVar1,AVar3,AVar4,AVar5);
                }
              }
              break;
            case 0x3c:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                pAVar27 = (ALint *)readle64();
                uVar8 = readle32();
                if (uVar8 == 0) {
                  pAVar28 = (ALint *)0x0;
                }
                else {
                  pAVar28 = (ALint *)get_ioblob((ulong)uVar8 * 4);
                  uVar31 = 0;
                  do {
                    uVar9 = readle32();
                    pAVar28[uVar31] = uVar9;
                    uVar31 = uVar31 + 1;
                  } while (uVar8 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alListeneriv(&callerinfo,uVar1,pAVar27,uVar8,pAVar28);
                }
              }
              break;
            case 0x3d:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                if (io_failure == '\0') {
                  visit_alListeneri(&callerinfo,uVar1,uVar8);
                }
              }
              break;
            case 0x3e:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                uVar9 = readle32();
                uVar6 = readle32();
                if (io_failure == '\0') {
                  visit_alListener3i(&callerinfo,uVar1,uVar8,uVar9,uVar6);
                }
              }
              break;
            case 0x3f:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                pAVar12 = (ALfloat *)readle64();
                uVar8 = readle32();
                if (uVar8 == 0) {
                  pAVar13 = (ALfloat *)0x0;
                }
                else {
                  pAVar13 = (ALfloat *)get_ioblob((ulong)uVar8 * 4);
                  uVar31 = 0;
                  do {
                    AVar3 = (ALfloat)readle32();
                    pAVar13[uVar31] = AVar3;
                    uVar31 = uVar31 + 1;
                  } while (uVar8 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alGetListenerfv(&callerinfo,uVar1,pAVar12,uVar8,pAVar13);
                }
              }
              break;
            case 0x40:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                pAVar12 = (ALfloat *)readle64();
                AVar3 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alGetListenerf(&callerinfo,uVar1,pAVar12,AVar3);
                }
              }
              break;
            case 0x41:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                pAVar12 = (ALfloat *)readle64();
                pAVar13 = (ALfloat *)readle64();
                origvalue3_00 = (ALfloat *)readle64();
                AVar3 = (ALfloat)readle32();
                AVar4 = (ALfloat)readle32();
                AVar5 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alGetListener3f
                            (&callerinfo,uVar1,pAVar12,pAVar13,origvalue3_00,AVar3,AVar4,AVar5);
                }
              }
              break;
            case 0x42:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                pAVar27 = (ALint *)readle64();
                uVar8 = readle32();
                if (io_failure == '\0') {
                  visit_alGetListeneri(&callerinfo,uVar1,pAVar27,uVar8);
                }
              }
              break;
            case 0x43:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                pAVar27 = (ALint *)readle64();
                uVar8 = readle32();
                if (uVar8 == 0) {
                  pAVar28 = (ALint *)0x0;
                }
                else {
                  pAVar28 = (ALint *)get_ioblob((ulong)uVar8 * 4);
                  uVar31 = 0;
                  do {
                    uVar9 = readle32();
                    pAVar28[uVar31] = uVar9;
                    uVar31 = uVar31 + 1;
                  } while (uVar8 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alGetListeneriv(&callerinfo,uVar1,pAVar27,uVar8,pAVar28);
                }
              }
              break;
            case 0x44:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                pAVar27 = (ALint *)readle64();
                pAVar28 = (ALint *)readle64();
                origvalue3 = (ALint *)readle64();
                uVar8 = readle32();
                uVar9 = readle32();
                uVar6 = readle32();
                if (io_failure == '\0') {
                  visit_alGetListener3i
                            (&callerinfo,uVar1,pAVar27,pAVar28,origvalue3,uVar8,uVar9,uVar6);
                }
              }
              break;
            case 0x45:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar18 = readle64();
                pAVar15 = (ALuint *)readle64();
                uVar30 = (uint)uVar18;
                pAVar16 = (ALuint *)get_ioblob((long)(int)uVar30 * 4);
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    uVar1 = readle32();
                    pAVar16[uVar31] = uVar1;
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alGenSources(&callerinfo,uVar30,pAVar15,pAVar16);
                }
              }
              break;
            case 0x46:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar18 = readle64();
                pAVar15 = (ALuint *)readle64();
                uVar30 = (uint)uVar18;
                pAVar16 = (ALuint *)get_ioblob((long)(int)uVar30 * 4);
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    uVar1 = readle32();
                    pAVar16[uVar31] = uVar1;
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alDeleteSources(&callerinfo,uVar30,pAVar15,pAVar16);
                }
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    add_sourcelabel_to_map(pAVar16[uVar31],(char *)0x0);
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
              }
              break;
            case 0x47:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                if (io_failure == '\0') {
                  visit_alIsSource(&callerinfo,(ALboolean)uVar8,uVar1);
                }
              }
              break;
            case 0x48:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                pAVar12 = (ALfloat *)readle64();
                uVar9 = readle32();
                pAVar13 = (ALfloat *)get_ioblob((ulong)uVar9 * 4);
                if (uVar9 != 0) {
                  uVar31 = 0;
                  do {
                    AVar3 = (ALfloat)readle32();
                    pAVar13[uVar31] = AVar3;
                    uVar31 = uVar31 + 1;
                  } while (uVar9 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alSourcefv(&callerinfo,uVar1,uVar8,pAVar12,uVar9,pAVar13);
                }
              }
              break;
            case 0x49:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                AVar3 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alSourcef(&callerinfo,uVar1,uVar8,AVar3);
                }
              }
              break;
            case 0x4a:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                AVar3 = (ALfloat)readle32();
                AVar4 = (ALfloat)readle32();
                AVar5 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alSource3f(&callerinfo,uVar1,uVar8,AVar3,AVar4,AVar5);
                }
              }
              break;
            case 0x4b:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                pAVar27 = (ALint *)readle64();
                uVar9 = readle32();
                pAVar28 = (ALint *)get_ioblob((ulong)uVar9 * 4);
                if (uVar9 != 0) {
                  uVar31 = 0;
                  do {
                    uVar6 = readle32();
                    pAVar28[uVar31] = uVar6;
                    uVar31 = uVar31 + 1;
                  } while (uVar9 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alSourceiv(&callerinfo,uVar1,uVar8,pAVar27,uVar9,pAVar28);
                }
              }
              break;
            case 0x4c:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                uVar9 = readle32();
                if (io_failure == '\0') {
                  visit_alSourcei(&callerinfo,uVar1,uVar8,uVar9);
                }
              }
              break;
            case 0x4d:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                uVar9 = readle32();
                uVar6 = readle32();
                uVar7 = readle32();
                if (io_failure == '\0') {
                  visit_alSource3i(&callerinfo,uVar1,uVar8,uVar9,uVar6,uVar7);
                }
              }
              break;
            case 0x4e:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar8 = readle32();
                uVar1 = readle32();
                pAVar12 = (ALfloat *)readle64();
                uVar9 = readle32();
                if (uVar9 == 0) {
                  pAVar13 = (ALfloat *)0x0;
                }
                else {
                  local_268 = (ALfloat *)CONCAT44(local_268._4_4_,uVar1);
                  pAVar13 = (ALfloat *)get_ioblob((ulong)uVar9 * 4);
                  uVar31 = 0;
                  do {
                    AVar3 = (ALfloat)readle32();
                    pAVar13[uVar31] = AVar3;
                    uVar31 = uVar31 + 1;
                  } while (uVar9 != uVar31);
                  uVar1 = (uint32)local_268;
                }
                if (io_failure == '\0') {
                  visit_alGetSourcefv(&callerinfo,uVar8,uVar1,pAVar12,uVar9,pAVar13);
                }
              }
              break;
            case 0x4f:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                pAVar12 = (ALfloat *)readle64();
                AVar3 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alGetSourcef(&callerinfo,uVar1,uVar8,pAVar12,AVar3);
                }
              }
              break;
            case 0x50:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                local_268 = (ALfloat *)readle64();
                pAVar12 = (ALfloat *)readle64();
                pAVar13 = (ALfloat *)readle64();
                AVar3 = (ALfloat)readle32();
                AVar4 = (ALfloat)readle32();
                AVar5 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alGetSource3f(&callerinfo,uVar1,uVar8,local_268,pAVar12,pAVar13,AVar3,AVar4,
                                      AVar5);
                }
              }
              break;
            case 0x51:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar8 = readle32();
                uVar1 = readle32();
                pAVar27 = (ALint *)readle64();
                uVar9 = readle32();
                if (uVar9 == 0) {
                  pAVar28 = (ALint *)0x0;
                }
                else {
                  local_268 = (ALfloat *)CONCAT44(local_268._4_4_,uVar1);
                  pAVar28 = (ALint *)get_ioblob((ulong)uVar9 * 4);
                  uVar31 = 0;
                  do {
                    uVar1 = readle32();
                    pAVar28[uVar31] = uVar1;
                    uVar31 = uVar31 + 1;
                  } while (uVar9 != uVar31);
                  uVar1 = (uint32)local_268;
                }
                if (io_failure == '\0') {
                  visit_alGetSourceiv(&callerinfo,uVar8,uVar1,uVar1 == 0x1010,pAVar27,uVar9,pAVar28)
                  ;
                }
              }
              break;
            case 0x52:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                pAVar27 = (ALint *)readle64();
                uVar9 = readle32();
                if (io_failure == '\0') {
                  visit_alGetSourcei(&callerinfo,uVar1,uVar8,uVar8 == 0x1010,pAVar27,uVar9);
                }
              }
              break;
            case 0x53:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                local_268 = (ALfloat *)readle64();
                pAVar27 = (ALint *)readle64();
                pAVar28 = (ALint *)readle64();
                uVar9 = readle32();
                uVar6 = readle32();
                uVar7 = readle32();
                if (io_failure == '\0') {
                  visit_alGetSource3i(&callerinfo,uVar1,uVar8,(ALint *)local_268,pAVar27,pAVar28,
                                      uVar9,uVar6,uVar7);
                }
              }
              break;
            case 0x54:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (uVar1 = readle32(), io_failure == '\0')) {
                visit_alSourcePlay(&callerinfo,uVar1);
              }
              break;
            case 0x55:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar18 = readle64();
                pAVar15 = (ALuint *)readle64();
                uVar30 = (uint)uVar18;
                pAVar16 = (ALuint *)get_ioblob((long)(int)uVar30 * 4);
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    uVar1 = readle32();
                    pAVar16[uVar31] = uVar1;
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alSourcePlayv(&callerinfo,uVar30,pAVar15,pAVar16);
                }
              }
              break;
            case 0x56:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (uVar1 = readle32(), io_failure == '\0')) {
                visit_alSourcePause(&callerinfo,uVar1);
              }
              break;
            case 0x57:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar18 = readle64();
                pAVar15 = (ALuint *)readle64();
                uVar30 = (uint)uVar18;
                pAVar16 = (ALuint *)get_ioblob((long)(int)uVar30 * 4);
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    uVar1 = readle32();
                    pAVar16[uVar31] = uVar1;
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alSourcePausev(&callerinfo,uVar30,pAVar15,pAVar16);
                }
              }
              break;
            case 0x58:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (uVar1 = readle32(), io_failure == '\0')) {
                visit_alSourceRewind(&callerinfo,uVar1);
              }
              break;
            case 0x59:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar18 = readle64();
                pAVar15 = (ALuint *)readle64();
                uVar30 = (uint)uVar18;
                pAVar16 = (ALuint *)get_ioblob((long)(int)uVar30 * 4);
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    uVar1 = readle32();
                    pAVar16[uVar31] = uVar1;
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alSourceRewindv(&callerinfo,uVar30,pAVar15,pAVar16);
                }
              }
              break;
            case 0x5a:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (uVar1 = readle32(), io_failure == '\0')) {
                visit_alSourceStop(&callerinfo,uVar1);
              }
              break;
            case 0x5b:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar18 = readle64();
                pAVar15 = (ALuint *)readle64();
                uVar30 = (uint)uVar18;
                pAVar16 = (ALuint *)get_ioblob((long)(int)uVar30 * 4);
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    uVar1 = readle32();
                    pAVar16[uVar31] = uVar1;
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alSourceStopv(&callerinfo,uVar30,pAVar15,pAVar16);
                }
              }
              break;
            case 0x5c:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar18 = readle64();
                pAVar15 = (ALuint *)readle64();
                uVar30 = (uint)uVar18;
                pAVar16 = (ALuint *)get_ioblob((long)(int)uVar30 * 4);
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    uVar8 = readle32();
                    pAVar16[uVar31] = uVar8;
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alSourceQueueBuffers(&callerinfo,uVar1,uVar30,pAVar15,pAVar16);
                }
              }
              break;
            case 0x5d:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar18 = readle64();
                pAVar15 = (ALuint *)readle64();
                uVar30 = (uint)uVar18;
                pAVar16 = (ALuint *)get_ioblob((long)(int)uVar30 * 4);
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    uVar8 = readle32();
                    pAVar16[uVar31] = uVar8;
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alSourceUnqueueBuffers(&callerinfo,uVar1,uVar30,pAVar15,pAVar16);
                }
              }
              break;
            case 0x5e:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar18 = readle64();
                pAVar15 = (ALuint *)readle64();
                uVar30 = (uint)uVar18;
                pAVar16 = (ALuint *)get_ioblob((long)(int)uVar30 * 4);
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    uVar1 = readle32();
                    pAVar16[uVar31] = uVar1;
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alGenBuffers(&callerinfo,uVar30,pAVar15,pAVar16);
                }
              }
              break;
            case 0x5f:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar18 = readle64();
                pAVar15 = (ALuint *)readle64();
                uVar30 = (uint)uVar18;
                pAVar16 = (ALuint *)get_ioblob((long)(int)uVar30 * 4);
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    uVar1 = readle32();
                    pAVar16[uVar31] = uVar1;
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alDeleteBuffers(&callerinfo,uVar30,pAVar15,pAVar16);
                }
                if (0 < (int)uVar30) {
                  uVar31 = 0;
                  do {
                    add_bufferlabel_to_map(pAVar16[uVar31],(char *)0x0);
                    uVar31 = uVar31 + 1;
                  } while ((uVar30 & 0x7fffffff) != uVar31);
                }
              }
              break;
            case 0x60:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                if (io_failure == '\0') {
                  visit_alIsBuffer(&callerinfo,(ALboolean)uVar8,uVar1);
                }
              }
              break;
            case 0x61:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                len = 0;
                uVar1 = readle32();
                uVar8 = readle32();
                uVar18 = readle64();
                origdata = (ALvoid *)readle64();
                puVar20 = IO_BLOB(&len);
                if (io_failure == '\0') {
                  visit_alBufferData(&callerinfo,uVar1,uVar8,origdata,puVar20,(ALCsizei)len,
                                     (ALsizei)uVar18);
                }
              }
              break;
            case 0x62:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                pAVar12 = (ALfloat *)readle64();
                uVar9 = readle32();
                pAVar13 = (ALfloat *)get_ioblob((ulong)uVar9 * 4);
                if (uVar9 != 0) {
                  uVar31 = 0;
                  do {
                    uVar6 = readle32();
                    pAVar13[uVar31] = (float)(int)uVar6;
                    uVar31 = uVar31 + 1;
                  } while (uVar9 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alBufferfv(&callerinfo,uVar1,uVar8,pAVar12,uVar9,pAVar13);
                }
              }
              break;
            case 99:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                AVar3 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alBufferf(&callerinfo,uVar1,uVar8,AVar3);
                }
              }
              break;
            case 100:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                AVar3 = (ALfloat)readle32();
                AVar4 = (ALfloat)readle32();
                AVar5 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alBuffer3f(&callerinfo,uVar1,uVar8,AVar3,AVar4,AVar5);
                }
              }
              break;
            case 0x65:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                pAVar27 = (ALint *)readle64();
                uVar9 = readle32();
                pAVar28 = (ALint *)get_ioblob((ulong)uVar9 * 4);
                if (uVar9 != 0) {
                  uVar31 = 0;
                  do {
                    uVar6 = readle32();
                    pAVar28[uVar31] = uVar6;
                    uVar31 = uVar31 + 1;
                  } while (uVar9 != uVar31);
                }
                if (io_failure == '\0') {
                  visit_alBufferiv(&callerinfo,uVar1,uVar8,pAVar27,uVar9,pAVar28);
                }
              }
              break;
            case 0x66:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                uVar9 = readle32();
                if (io_failure == '\0') {
                  visit_alBufferi(&callerinfo,uVar1,uVar8,uVar9);
                }
              }
              break;
            case 0x67:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                uVar9 = readle32();
                uVar6 = readle32();
                uVar7 = readle32();
                if (io_failure == '\0') {
                  visit_alBuffer3i(&callerinfo,uVar1,uVar8,uVar9,uVar6,uVar7);
                }
              }
              break;
            case 0x68:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar8 = readle32();
                uVar1 = readle32();
                pAVar12 = (ALfloat *)readle64();
                uVar9 = readle32();
                if (uVar9 == 0) {
                  pAVar13 = (ALfloat *)0x0;
                }
                else {
                  local_268 = (ALfloat *)CONCAT44(local_268._4_4_,uVar1);
                  pAVar13 = (ALfloat *)get_ioblob((ulong)uVar9 * 4);
                  uVar31 = 0;
                  do {
                    AVar3 = (ALfloat)readle32();
                    pAVar13[uVar31] = AVar3;
                    uVar31 = uVar31 + 1;
                  } while (uVar9 != uVar31);
                  uVar1 = (uint32)local_268;
                }
                if (io_failure == '\0') {
                  visit_alGetBufferfv(&callerinfo,uVar8,uVar1,pAVar12,uVar9,pAVar13);
                }
              }
              break;
            case 0x69:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                pAVar12 = (ALfloat *)readle64();
                AVar3 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alGetBufferf(&callerinfo,uVar1,uVar8,pAVar12,AVar3);
                }
              }
              break;
            case 0x6a:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                local_268 = (ALfloat *)readle64();
                pAVar12 = (ALfloat *)readle64();
                pAVar13 = (ALfloat *)readle64();
                AVar3 = (ALfloat)readle32();
                AVar4 = (ALfloat)readle32();
                AVar5 = (ALfloat)readle32();
                if (io_failure == '\0') {
                  visit_alGetBuffer3f(&callerinfo,uVar1,uVar8,local_268,pAVar12,pAVar13,AVar3,AVar4,
                                      AVar5);
                }
              }
              break;
            case 0x6b:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                pAVar27 = (ALint *)readle64();
                uVar9 = readle32();
                if (io_failure == '\0') {
                  visit_alGetBufferi(&callerinfo,uVar1,uVar8,pAVar27,uVar9);
                }
              }
              break;
            case 0x6c:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                uVar8 = readle32();
                local_268 = (ALfloat *)readle64();
                pAVar27 = (ALint *)readle64();
                pAVar28 = (ALint *)readle64();
                uVar9 = readle32();
                uVar6 = readle32();
                uVar7 = readle32();
                if (io_failure == '\0') {
                  visit_alGetBuffer3i(&callerinfo,uVar1,uVar8,(ALint *)local_268,pAVar27,pAVar28,
                                      uVar9,uVar6,uVar7);
                }
              }
              break;
            case 0x6d:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar8 = readle32();
                uVar1 = readle32();
                pAVar27 = (ALint *)readle64();
                uVar9 = readle32();
                if (uVar9 == 0) {
                  pAVar28 = (ALint *)0x0;
                }
                else {
                  local_268 = (ALfloat *)CONCAT44(local_268._4_4_,uVar1);
                  pAVar28 = (ALint *)get_ioblob((ulong)uVar9 * 4);
                  uVar31 = 0;
                  do {
                    uVar1 = readle32();
                    pAVar28[uVar31] = uVar1;
                    uVar31 = uVar31 + 1;
                  } while (uVar9 != uVar31);
                  uVar1 = (uint32)local_268;
                }
                if (io_failure == '\0') {
                  visit_alGetBufferiv(&callerinfo,uVar8,uVar1,pAVar27,uVar9,pAVar28);
                }
              }
              break;
            case 0x6e:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                puVar20 = IO_BLOB(&len);
                if (io_failure == '\0') {
                  visit_alTracePushScope(&callerinfo,(ALchar *)puVar20);
                }
                trace_scope = trace_scope + 1;
              }
              break;
            case 0x6f:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                callerinfo.trace_scope = callerinfo.trace_scope - 1;
                trace_scope = trace_scope - 1;
                visit_alTracePopScope(&callerinfo);
              }
              break;
            case 0x70:
              IO_ENTRYINFO(&callerinfo);
              if ((io_failure == '\0') && (puVar20 = IO_BLOB(&len), io_failure == '\0')) {
                visit_alTraceMessage(&callerinfo,(ALchar *)puVar20);
              }
              break;
            case 0x71:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                puVar20 = IO_BLOB(&len);
                if (uVar1 != 0) {
                  if (puVar20 == (uint8 *)0x0) {
                    pcVar21 = (char *)0x0;
                  }
                  else {
                    pcVar21 = strdup((char *)puVar20);
                    if (pcVar21 == (char *)0x0) goto LAB_0010fe0f;
                  }
                  add_bufferlabel_to_map(uVar1,pcVar21);
                }
LAB_0010fe0f:
                if (io_failure == '\0') {
                  visit_alTraceBufferLabel(&callerinfo,uVar1,(ALchar *)puVar20);
                }
              }
              break;
            case 0x72:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                uVar1 = readle32();
                puVar20 = IO_BLOB(&len);
                if (uVar1 != 0) {
                  if (puVar20 == (uint8 *)0x0) {
                    pcVar21 = (char *)0x0;
                  }
                  else {
                    pcVar21 = strdup((char *)puVar20);
                    if (pcVar21 == (char *)0x0) goto LAB_0010fdc7;
                  }
                  add_sourcelabel_to_map(uVar1,pcVar21);
                }
LAB_0010fdc7:
                if (io_failure == '\0') {
                  visit_alTraceSourceLabel(&callerinfo,uVar1,(ALchar *)puVar20);
                }
              }
              break;
            case 0x73:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar14 = (ALCdevice *)readle64();
                puVar20 = IO_BLOB(&len);
                if (pAVar14 != (ALCdevice *)0x0) {
                  if (puVar20 == (uint8 *)0x0) {
                    pcVar21 = (char *)0x0;
                  }
                  else {
                    pcVar21 = strdup((char *)puVar20);
                    if (pcVar21 == (char *)0x0) goto LAB_0010fda3;
                  }
                  add_devicelabel_to_map(pAVar14,pcVar21);
                }
LAB_0010fda3:
                if (io_failure == '\0') {
                  visit_alcTraceDeviceLabel(&callerinfo,pAVar14,(ALCchar *)puVar20);
                }
              }
              break;
            case 0x74:
              IO_ENTRYINFO(&callerinfo);
              if (io_failure == '\0') {
                pAVar19 = (ALCcontext *)readle64();
                puVar20 = IO_BLOB(&len);
                if (pAVar19 != (ALCcontext *)0x0) {
                  if (puVar20 == (uint8 *)0x0) {
                    pcVar21 = (char *)0x0;
                  }
                  else {
                    pcVar21 = strdup((char *)puVar20);
                    if (pcVar21 == (char *)0x0) goto LAB_0010fdeb;
                  }
                  add_contextlabel_to_map(pAVar19,pcVar21);
                }
LAB_0010fdeb:
                if (io_failure == '\0') {
                  visit_alcTraceContextLabel(&callerinfo,pAVar19,(ALCchar *)puVar20);
                }
              }
            }
            iVar29 = 0;
          } while (io_failure == '\0');
        }
LAB_0010d08b:
        visit_eos(guserdata,'\0',0);
LAB_0010d09b:
        quit_altrace_playback();
        return iVar29;
      }
      process_tracelog_cold_2();
    }
    else {
      process_tracelog_cold_1();
    }
  }
  quit_altrace_playback();
  return 0;
}

Assistant:

int process_tracelog(const char *fname, void *userdata)
{
    int retval = 1;
    int eos = 0;
    off_t fdoffset = 0;
    off_t fdsize = 0;

    if (!init_altrace_playback(fname, userdata)) {
        return 0;
    }

    fdoffset = lseek(logfd, 0, SEEK_CUR);
    fdsize = lseek(logfd, 0, SEEK_END);
    if ((lseek(logfd, fdoffset, SEEK_SET) == -1) || (fdoffset == -1) || (fdsize == -1)) {
        fprintf(stderr, "%s: Failed to seek in file: %s\n", GAppName, strerror(errno));
        io_failure = 1;
    }

    while (!eos) {
        if (!io_failure) {
            fdoffset = lseek(logfd, 0, SEEK_CUR);
            if (fdoffset == -1) {
                fprintf(stderr, "%s: Failed to get current file offset: %s\n", GAppName, strerror(errno));
                io_failure = 1;
            }
        }

        if (io_failure) {
            retval = 0;
            eos = 1;
            break;
        }

        if (!visit_progress(guserdata, fdoffset, fdsize)) {
            fprintf(stderr, "%s: Application cancelled file processing!\n", GAppName);
            visit_eos(guserdata, AL_FALSE, 0);
            retval = -1;
            eos = 1;
            break;
        }

        switch (IO_EVENTENUM()) {
            #define ENTRYPOINT(ret,name,params,args,numargs,visitparams,visitargs) case ALEE_##name: decode_##name(); break;
            #include "altrace_entrypoints.h"

            case ALEE_NEW_CALLSTACK_SYMS:
                decode_callstack_syms_event();
                break;

            case ALEE_ALERROR_TRIGGERED:
                decode_al_error_event();
                break;

            case ALEE_ALCERROR_TRIGGERED:
                decode_alc_error_event();
                break;

            case ALEE_DEVICE_STATE_CHANGED_INT:
                decode_device_state_changed_int();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_ENUM:
                decode_context_state_changed_enum();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_FLOAT:
                decode_context_state_changed_float();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_STRING:
                decode_context_state_changed_string();
                break;

            case ALEE_LISTENER_STATE_CHANGED_FLOATV:
                decode_listener_state_changed_floatv();
                break;

            case ALEE_SOURCE_STATE_CHANGED_BOOL:
                decode_source_state_changed_bool();
                break;

            case ALEE_SOURCE_STATE_CHANGED_ENUM:
                decode_source_state_changed_enum();
                break;

            case ALEE_SOURCE_STATE_CHANGED_INT:
                decode_source_state_changed_int();
                break;

            case ALEE_SOURCE_STATE_CHANGED_UINT:
                decode_source_state_changed_uint();
                break;

            case ALEE_SOURCE_STATE_CHANGED_FLOAT:
                decode_source_state_changed_float();
                break;

            case ALEE_SOURCE_STATE_CHANGED_FLOAT3:
                decode_source_state_changed_float3();
                break;

            case ALEE_BUFFER_STATE_CHANGED_INT:
                decode_buffer_state_changed_int();
                break;

            case ALEE_EOS:
                decode_eos();
                eos = 1;
                break;

            default:
                if (!io_failure) {
                    visit_eos(guserdata, AL_FALSE, 0);
                }
                retval = 0;
                eos = 1;
                break;
        }
    }

    if (io_failure) {
        visit_eos(guserdata, AL_FALSE, 0);
    }

    quit_altrace_playback();

    return retval;
}